

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

bool lexer_CaptureMacroBody(CaptureBody *capture)

{
  bool bVar1;
  int iVar2;
  int local_14;
  int c;
  CaptureBody *capture_local;
  
  startCapture(capture);
  if ((lexerState->isMmapped & 1U) != 0) {
    (lexerState->field_2).field_0.isReferenced = true;
  }
  if ((lexerState->atLineStart & 1U) == 0) {
    __assert_fail("lexerState->atLineStart",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/lexer.cpp"
                  ,0x9f7,"lexer_CaptureMacroBody");
  }
  do {
    nextLine();
    do {
      local_14 = nextChar();
      bVar1 = isWhitespace(local_14);
    } while (bVar1);
    bVar1 = startsIdentifier(local_14);
    if (bVar1) {
      iVar2 = readIdentifier((char)local_14);
      if (iVar2 == 0x6c) {
        lexerState->captureSize = lexerState->captureSize - 4;
LAB_00111659:
        endCapture(capture);
        lexerState->atLineStart = false;
        return local_14 != -1;
      }
    }
    while( true ) {
      if (local_14 == -1) {
        error("Unterminated macro definition\n");
        goto LAB_00111659;
      }
      if ((local_14 == 10) || (local_14 == 0xd)) break;
      local_14 = nextChar();
    }
    handleCRLF(local_14);
  } while( true );
}

Assistant:

bool lexer_CaptureMacroBody(struct CaptureBody *capture)
{
	startCapture(capture);

	// If the file is `mmap`ed, we need not to unmap it to keep access to the macro
	if (lexerState->isMmapped)
		lexerState->isReferenced = true;

	int c = EOF;

	// Due to parser internals, it reads the EOL after the expression before calling this.
	// Thus, we don't need to keep one in the buffer afterwards.
	// The following assertion checks that.
	assert(lexerState->atLineStart);
	for (;;) {
		nextLine();
		// We're at line start, so attempt to match an `ENDM` token
		do { // Discard initial whitespace
			c = nextChar();
		} while (isWhitespace(c));
		// Now, try to match `ENDM` as a **whole** identifier
		if (startsIdentifier(c)) {
			switch (readIdentifier(c)) {
			case T_POP_ENDM:
				// The ENDM has been captured, but we don't want it!
				// We know we have read exactly "ENDM", not e.g. an EQUS
				lexerState->captureSize -= strlen("ENDM");
				goto finish;
			}
		}

		// Just consume characters until EOL or EOF
		for (;; c = nextChar()) {
			if (c == EOF) {
				error("Unterminated macro definition\n");
				goto finish;
			} else if (c == '\n' || c == '\r') {
				handleCRLF(c);
				break;
			}
		}
	}

finish:
	endCapture(capture);
	// ENDM or EOF puts us past the start of the line
	lexerState->atLineStart = false;

	// Returns true if an ENDM terminated the block, false if it reached EOF first
	return c != EOF;
}